

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O1

bool __thiscall
glcts::ViewportArray::DynamicViewportIndex::checkResults
          (DynamicViewportIndex *this,texture *texture_0,texture *param_2,GLuint draw_call_index)

{
  bool bVar1;
  bool bVar2;
  uint expected_value;
  GLuint x;
  uint uVar3;
  GLuint y;
  vector<int,_std::allocator<int>_> texture_data;
  vector<int,_std::allocator<int>_> local_48;
  
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (GLint *)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&local_48,0x4000);
  Utils::texture::get(texture_0,0x8d94,0x1404,
                      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
  bVar2 = true;
  y = 0;
  uVar3 = 0;
  do {
    x = 0;
    do {
      expected_value = uVar3;
      if (draw_call_index < uVar3) {
        expected_value = 0xffffffff;
      }
      bVar1 = DrawTestBase::checkRegionR32I
                        (&this->super_DrawTestBase,x,y,0x20,0x20,expected_value,
                         local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start);
      uVar3 = uVar3 + bVar1;
      if (!bVar1) {
        bVar2 = false;
        break;
      }
      x = x + 1;
    } while (x != 4);
    if ((!bVar1) || (y = y + 1, y == 4)) {
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (GLint *)0x0) {
        operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return bVar2;
    }
  } while( true );
}

Assistant:

bool DynamicViewportIndex::checkResults(Utils::texture& texture_0, Utils::texture& /* texture_1 */,
										GLuint			draw_call_index)
{
	bool   check_result = true;
	GLuint index		= 0;

	std::vector<GLint> texture_data;
	texture_data.resize(m_width * m_height);
	texture_0.get(GL_RED_INTEGER, GL_INT, &texture_data[0]);

	for (GLuint y = 0; y < 4; ++y)
	{
		for (GLuint x = 0; x < 4; ++x)
		{
			GLint expected_value = -1;
			if (index <= draw_call_index)
			{
				expected_value = index;
			}

			bool result = checkRegionR32I(x, y, expected_value, &texture_data[0]);

			if (false == result)
			{
				check_result = false;
				goto end;
			}

			index += 1;
		}
	}

end:
	return check_result;
}